

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport_pdu.h
# Opt level: O0

void __thiscall assembler::TransportPDU::TransportPDU(TransportPDU *this)

{
  size_type in_RDI;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *unaff_retaddr;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2db550);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x2db563);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(unaff_retaddr,in_RDI);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(unaff_retaddr,in_RDI);
  return;
}

Assistant:

TransportPDU() {
    header.reserve(headerBytes);
    data.reserve(dataBytes);
  }